

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.h
# Opt level: O2

void __thiscall Net::Conv(Net *this)

{
  Scalar *src;
  DenseCoeffsBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_1> *this_00;
  Scalar *pSVar1;
  Index row;
  int j;
  long startCol;
  int i;
  long startRow;
  Scalar SVar2;
  MatrixXf *local_d8;
  Matrix<float,__1,__1,_0,__1,__1> *local_d0;
  MatrixXf cur2;
  MatrixXf cur3;
  MatrixXf cur1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_68 [2];
  
  cur1.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  cur1.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  cur1.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  cur3.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  cur3.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  cur3.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  for (row = 0; row != 8; row = row + 1) {
    src = Eigen::
          DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_8,_1,_0,_8,_1>,_1>::
          operator()((DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_8,_1,_0,_8,_1>,_1>
                      *)&this->convKernel,row,0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,3,3,0,3,3>>(&cur2,src);
    for (startRow = 0; startRow != 0x2e; startRow = startRow + 1) {
      for (startCol = 0; startCol != 0x16; startCol = startCol + 1) {
        Eigen::Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false> *)local_68,
                   &this->pad,startRow,startCol,3,3);
        Eigen::internal::
        call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,50,26,0,50,26>,_1,_1,false>>
                  (&cur1,(Block<Eigen::Matrix<float,_50,_26,_0,_50,_26>,__1,__1,_false> *)local_68);
        local_d8 = &cur2;
        local_d0 = &cur1;
        Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                  (local_68,(ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)
                            &local_d0,
                   (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)
                   &local_d8);
        Eigen::internal::
        call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,_1,0,_1,_1>>const,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,_1,0,_1,_1>>const>>
                  ((Matrix<float,__1,__1,_0,__1,__1> *)&cur3,local_68);
        SVar2 = Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::sum
                          ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&cur3);
        this_00 = (DenseCoeffsBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_1> *)
                  Eigen::
                  DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Matrix<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_8,_1,_0,_8,_1>,_1>
                                *)&this->convData,row,0);
        pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_1>::operator()
                           (this_00,startRow,startCol);
        *pSVar1 = SVar2;
      }
    }
  }
  free(cur3.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(cur2.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(cur1.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void Net::Conv()
{
    MatrixXf cur1,cur2,cur3;

    for(int k = 0 ;k < CONV_CHANNEL; k++)
    {
        cur2 = convKernel(k,0);
        for(int i = 0; i <= BLOCK_HEIGHT - CONVKS; i++)
        {
            for(int j = 0; j <= BLOCK_WIDTH  - CONVKS; j++)
            {
                if(i < 0 || j < 0)
                    assert("Conv Error!");
                cur1 = pad.block(i,j,CONVKS,CONVKS);
                cur3 = cur1.array()*cur2.array();
                //FUCK YOU EIGEN
                (convData(k,0))(i,j) = cur3.sum();

                //To-Do::Added offset activation function

            }
        }
    }
}